

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O2

void init_crc16_tab(void)

{
  ulong uVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    sVar2 = 8;
    uVar3 = 0;
    uVar4 = uVar1 & 0xffffffff;
    while( true ) {
      bVar7 = sVar2 == 0;
      sVar2 = sVar2 + -1;
      if (bVar7) break;
      uVar5 = (uint)uVar4 ^ uVar3;
      uVar6 = (uVar3 & 0xffff) >> 1;
      uVar3 = uVar6 ^ 0xffffa001;
      if ((uVar5 & 1) == 0) {
        uVar3 = uVar6;
      }
      uVar4 = (uVar4 & 0xffff) >> 1;
    }
    crc_tab16[uVar1] = (uint16_t)uVar3;
  }
  crc_tab16_init = 1;
  return;
}

Assistant:

static void init_crc16_tab(void) {
  uint16_t i;
  uint16_t j;
  uint16_t crc;
  uint16_t c;

  for (i = 0; i < 256; i++) {
    crc = 0;
    c = i;

    for (j = 0; j < 8; j++) {
      if ((crc ^ c) & 0x0001)
        crc = (crc >> 1) ^ CRC_POLY_16;
      else
        crc = crc >> 1;

      c = c >> 1;
    }

    crc_tab16[i] = crc;
  }

  crc_tab16_init = true;

}